

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void resume(result *result,ostream *os)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  uint local_64;
  size_type local_60;
  size_t e_1;
  size_t i_1;
  size_type local_48;
  size_t e;
  size_t i;
  solution *elem;
  const_iterator __end2;
  const_iterator __begin2;
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *__range2;
  ostream *os_local;
  result *result_local;
  
  fmt::v7::
  print<char[174],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,int_const&,double_const&,long_const&,char>
            (os,(char (*) [174])
                "\\ solver................: {}\n\\ constraints...........: {}\n\\ variables.............: {}\n\\ duration..............: {:f}\n\\ loop..................: {}\n\\ status................: "
             ,&result->method,&result->constraints,&result->variables,&result->duration,
             &result->loop);
  switch(result->status) {
  case success:
    fmt::v7::print<char[16],,char>(os,(char (*) [16])"solution found\n");
    bVar1 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::empty
                      (&result->solutions);
    if (!bVar1) {
      pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                         (&result->solutions);
      fmt::v7::print<char[58],double_const&,char>
                (os,(char (*) [58])"\\ value.................: {:f}\n\\ other value...........: ",
                 &pvVar2->value);
      __end2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::begin
                         (&result->solutions);
      elem = (solution *)
             std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::end
                       (&result->solutions);
      while (bVar1 = __gnu_cxx::
                     operator==<const_baryonyx::solution_*,_std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>_>
                               (&__end2,(__normal_iterator<const_baryonyx::solution_*,_std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>_>
                                         *)&elem), ((bVar1 ^ 0xffU) & 1) != 0) {
        i = (size_t)__gnu_cxx::
                    __normal_iterator<const_baryonyx::solution_*,_std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>_>
                    ::operator*(&__end2);
        fmt::v7::print<char[4],double_const&,char>(os,(char (*) [4])0xc9dcb3,&((reference)i)->value)
        ;
        __gnu_cxx::
        __normal_iterator<const_baryonyx::solution_*,_std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>_>
        ::operator++(&__end2);
      }
      fmt::v7::print<char[2],,char>(os,(char (*) [2])0xc9a94b);
      fmt::v7::print<char[28],,char>(os,(char (*) [28])"\\ variables.............: \n");
      e = 0;
      local_48 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::size(&(result->affected_vars).names);
      for (; e != local_48; e = e + 1) {
        pvVar3 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[](&(result->affected_vars).names,e);
        pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&(result->affected_vars).values,e);
        i_1._4_4_ = (uint)(*pvVar4 != '\0');
        fmt::v7::print<char[7],std::basic_string_view<char,std::char_traits<char>>const&,int,char>
                  (os,(char (*) [7])"{}={}\n",pvVar3,(int *)((long)&i_1 + 4));
      }
      e_1 = 0;
      pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                         (&result->solutions);
      local_60 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar2->variables);
      for (; e_1 != local_60; e_1 = e_1 + 1) {
        pvVar3 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[](&result->variable_name,e_1);
        pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                           (&result->solutions);
        pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&pvVar2->variables,e_1);
        local_64 = (uint)(*pvVar4 != '\0');
        fmt::v7::print<char[7],std::basic_string_view<char,std::char_traits<char>>const&,int,char>
                  (os,(char (*) [7])"{}={}\n",pvVar3,(int *)&local_64);
      }
    }
    break;
  case internal_error:
    fmt::v7::print<char[25],,char>(os,(char (*) [25])"internal error reported\n");
    break;
  case uninitialized:
    fmt::v7::print<char[15],,char>(os,(char (*) [15])0xc9a705);
    break;
  case time_limit_reached:
    fmt::v7::print<char[49],int_const&,char>
              (os,(char (*) [49])"time limit reached\n\\ remaining constraints.: {}\n",
               &result->remaining_constraints);
    break;
  case kappa_max_reached:
    fmt::v7::print<char[48],int_const&,char>
              (os,(char (*) [48])"kappa max reached\n\\ remaining constraints.: {}\n",
               &result->remaining_constraints);
    break;
  case limit_reached:
    fmt::v7::print<char[44],int_const&,char>
              (os,(char (*) [44])0xc9a959,&result->remaining_constraints);
    break;
  case empty_context:
    fmt::v7::print<char[23],,char>(os,(char (*) [23])"context uninitialized\n");
  }
  return;
}

Assistant:

static void
resume(const baryonyx::result& result, std::ostream& os) noexcept
{
    fmt::print(os,
               "\\ solver................: {}\n"
               "\\ constraints...........: {}\n"
               "\\ variables.............: {}\n"
               "\\ duration..............: {:f}\n"
               "\\ loop..................: {}\n"
               "\\ status................: ",
               result.method,
               result.constraints,
               result.variables,
               result.duration,
               result.loop);

    switch (result.status) {
    case baryonyx::result_status::internal_error:
        fmt::print(os, "internal error reported\n");
        break;
    case baryonyx::result_status::uninitialized:
        fmt::print(os, "uninitialized\n");
        break;
    case baryonyx::result_status::success:
        fmt::print(os, "solution found\n");

        if (result.solutions.empty()) // Baryonyx ensures solutions are not
            break;                    // empty.

        fmt::print(os,
                   "\\ value.................: {:f}\n"
                   "\\ other value...........: ",
                   result.solutions.back().value);

        for (const auto& elem : result.solutions)
            fmt::print(os, "{} ", elem.value);
        fmt::print(os, "\n");
        fmt::print(os, "\\ variables.............: \n");

        for (std::size_t i{ 0 }, e{ result.affected_vars.names.size() };
             i != e;
             ++i)
            fmt::print(os,
                       "{}={}\n",
                       result.affected_vars.names[i],
                       (result.affected_vars.values[i] ? 1 : 0));

        for (std::size_t i{ 0 }, e{ result.solutions.back().variables.size() };
             i != e;
             ++i)
            fmt::print(os,
                       "{}={}\n",
                       result.variable_name[i],
                       (result.solutions.back().variables[i] ? 1 : 0));

        break;
    case baryonyx::result_status::time_limit_reached:
        fmt::print(os,
                   "time limit reached\n"
                   "\\ remaining constraints.: {}\n",
                   result.remaining_constraints);
        break;
    case baryonyx::result_status::kappa_max_reached:
        fmt::print(os,
                   "kappa max reached\n"
                   "\\ remaining constraints.: {}\n",
                   result.remaining_constraints);
        break;
    case baryonyx::result_status::limit_reached:
        fmt::print(os,
                   "limit reached\n"
                   "\\ remaining constraints.: {}\n",
                   result.remaining_constraints);
        break;
    case baryonyx::result_status::empty_context:
        fmt::print(os, "context uninitialized\n");
        break;
    }
}